

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Evaluate
          (WindowDistinctAggregatorLocalState *this,WindowDistinctAggregatorGlobalState *gdstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  ulong uVar1;
  WindowDistinctSortTree *this_00;
  vector<unsigned_long,_true> *this_01;
  WindowExcludeMode WVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  pointer puVar10;
  value_type vVar11;
  idx_t iVar12;
  pointer puVar13;
  idx_t iVar14;
  bool bVar15;
  const_reference pvVar16;
  reference pvVar17;
  const_reference pvVar18;
  unsigned_long uVar19;
  long lVar20;
  vector<unsigned_long,_true> *this_02;
  const_reference pvVar21;
  ulong uVar22;
  unsigned_long uVar23;
  SubFrames *this_03;
  pointer puVar24;
  ulong uVar25;
  size_type sVar26;
  ulong uVar27;
  unsigned_long run_begin_1;
  ulong uVar28;
  ulong val;
  idx_t run_begin;
  ulong uVar29;
  ulong uVar30;
  size_type __n;
  size_type __n_00;
  WindowAggregateStates *this_04;
  ulong *puVar31;
  ulong *puVar32;
  ulong uVar33;
  ulong uVar34;
  idx_t iVar35;
  long lVar36;
  size_type __n_01;
  ulong local_f8;
  
  pdVar3 = (this->statep).data;
  pdVar4 = (this->statel).data;
  WVar2 = ((gdstate->super_WindowAggregatorGlobalState).aggregator)->exclude_mode;
  this_04 = &this->statef;
  WindowAggregateStates::Initialize(this_04,count);
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  pdVar5 = pvVar16->data;
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  pdVar6 = pvVar16->data;
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  pdVar7 = pvVar16->data;
  pvVar16 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  if (count != 0) {
    this_00 = &gdstate->merge_sort_tree;
    this_03 = &this->frames;
    pdVar8 = pvVar16->data;
    this_01 = &gdstate->levels_flat_start;
    iVar35 = 0;
    do {
      uVar30 = *(ulong *)(pdVar5 + iVar35 * 8);
      uVar9 = *(ulong *)(pdVar6 + iVar35 * 8);
      if (WVar2 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar22 = row_idx;
        if (WVar2 != CURRENT_ROW) {
          uVar22 = *(ulong *)(pdVar7 + iVar35 * 8);
        }
        if (uVar9 <= uVar22) {
          uVar22 = uVar9;
        }
        if (uVar22 <= uVar30) {
          uVar22 = uVar30;
        }
        pvVar17 = vector<duckdb::FrameBounds,_true>::operator[](this_03,0);
        pvVar17->start = uVar30;
        pvVar17->end = uVar22;
        __n = 1;
        if (WVar2 == TIES) {
          uVar22 = uVar30;
          if (uVar30 < row_idx) {
            uVar22 = row_idx;
          }
          if (uVar9 <= uVar22) {
            uVar22 = uVar9;
          }
          uVar29 = row_idx + 1;
          if (uVar9 <= row_idx + 1) {
            uVar29 = uVar9;
          }
          if (uVar29 <= uVar30) {
            uVar29 = uVar30;
          }
          pvVar17 = vector<duckdb::FrameBounds,_true>::operator[](this_03,1);
          pvVar17->start = uVar22;
          pvVar17->end = uVar29;
          __n = 2;
        }
        if (WVar2 == CURRENT_ROW) {
          uVar22 = row_idx + 1;
        }
        else {
          uVar22 = *(ulong *)(pdVar8 + iVar35 * 8);
        }
        if (uVar30 < uVar22) {
          uVar30 = uVar22;
        }
        if (uVar9 <= uVar30) {
          uVar30 = uVar9;
        }
      }
      pvVar17 = vector<duckdb::FrameBounds,_true>::operator[](this_03,__n);
      pvVar17->start = uVar30;
      pvVar17->end = uVar9;
      puVar24 = (this->statef).states.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + (this->statef).state_size * iVar35;
      pvVar17 = vector<duckdb::FrameBounds,_true>::operator[](this_03,0);
      uVar30 = pvVar17->start;
      pvVar17 = vector<duckdb::FrameBounds,_true>::operator[](this_03,0);
      uVar9 = pvVar17->end;
      if (uVar30 < uVar9) {
        uVar22 = uVar9 - 1;
        uVar29 = 1;
        uVar28 = uVar30;
        if (uVar22 == uVar30) {
          uVar25 = 0;
          sVar26 = 0;
          local_f8 = uVar30;
        }
        else {
          sVar26 = 0;
          do {
            uVar25 = uVar22;
            uVar28 = uVar28 >> 5;
            uVar22 = uVar25 >> 5;
            uVar29 = uVar29 * 0x20;
            sVar26 = sVar26 + 1;
          } while (uVar28 != uVar22);
          local_f8 = uVar29 * uVar25 >> 5;
        }
        uVar1 = uVar30 + 1;
        val = local_f8;
        if (2 < sVar26) {
          uVar28 = uVar28 * uVar29;
          pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                  *)this_00,0);
          uVar33 = (long)(pvVar18->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar18->first).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          if (uVar28 + uVar29 <= uVar33) {
            uVar33 = uVar28 + uVar29;
          }
          pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                  *)this_00,sVar26);
          puVar10 = (pvVar18->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar32 = puVar10 + uVar28;
          uVar34 = uVar33 - uVar28;
          if (uVar34 != 0 && (long)uVar28 <= (long)uVar33) {
            do {
              uVar33 = uVar34 >> 1;
              uVar27 = ~uVar33 + uVar34;
              uVar34 = uVar33;
              if (puVar32[uVar33] < uVar1) {
                puVar32 = puVar32 + uVar33 + 1;
                uVar34 = uVar27;
              }
            } while (0 < (long)uVar34);
          }
          uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((long)puVar32 - (long)puVar10 >> 3);
          lVar20 = (uVar28 / uVar29) * 0x40;
          lVar36 = uVar25 + uVar22 * -0x20 + (uVar19 & 0xffffffffffffffe0);
          __n_00 = lVar36 + lVar20;
          __n_01 = (lVar36 + lVar20) - 0x20;
          uVar22 = sVar26;
          do {
            sVar26 = uVar22 - 1;
            uVar29 = uVar29 >> 5;
            pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                    *)this_00,sVar26);
            puVar10 = (pvVar18->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                    *)this_00,uVar22);
            this_02 = &pvVar18->second;
            __n_01 = __n_01 + 0x1f;
            uVar28 = local_f8 - uVar30;
            while (uVar29 <= uVar28) {
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_01);
              vVar11 = *pvVar21;
              puVar32 = puVar10 + vVar11;
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_01 + 0x20);
              uVar28 = *pvVar21 - vVar11;
              if (uVar28 != 0 && (long)vVar11 <= (long)*pvVar21) {
                do {
                  uVar25 = uVar28 >> 1;
                  uVar33 = ~uVar25 + uVar28;
                  uVar28 = uVar25;
                  if (puVar32[uVar25] < uVar1) {
                    puVar32 = puVar32 + uVar25 + 1;
                    uVar28 = uVar33;
                  }
                } while (0 < (long)uVar28);
              }
              local_f8 = local_f8 - uVar29;
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              if (uVar19 != local_f8) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_01,sVar26);
                vVar11 = *pvVar21;
                iVar12 = (gdstate->levels_flat_native).state_size;
                puVar13 = (gdstate->levels_flat_native).states.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar14 = this->flush_count;
                *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
                this->flush_count = iVar14 + 1;
                *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + uVar19 + -1) * iVar12;
                if (0x7ff < iVar14 + 1) {
                  FlushStates(this);
                }
              }
              __n_01 = __n_01 - 1;
              uVar28 = local_f8 - uVar30;
            }
            if (local_f8 != uVar30) {
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_01);
              vVar11 = *pvVar21;
              puVar32 = puVar10 + vVar11;
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_01 + 0x20);
              uVar28 = *pvVar21 - vVar11;
              if (uVar28 != 0 && (long)vVar11 <= (long)*pvVar21) {
                do {
                  uVar25 = uVar28 >> 1;
                  uVar33 = ~uVar25 + uVar28;
                  uVar28 = uVar25;
                  if (puVar32[uVar25] < uVar1) {
                    puVar32 = puVar32 + uVar25 + 1;
                    uVar28 = uVar33;
                  }
                } while (0 < (long)uVar28);
              }
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              __n_01 = (uVar30 / uVar29) * 0x40 + (uVar19 & 0xffffffffffffffe0);
            }
            for (; uVar29 <= uVar9 - val; val = val + uVar29) {
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_00);
              vVar11 = *pvVar21;
              puVar32 = puVar10 + vVar11;
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_00 + 0x20);
              uVar28 = *pvVar21 - vVar11;
              if (uVar28 != 0 && (long)vVar11 <= (long)*pvVar21) {
                do {
                  uVar25 = uVar28 >> 1;
                  uVar33 = ~uVar25 + uVar28;
                  uVar28 = uVar25;
                  if (puVar32[uVar25] < uVar1) {
                    puVar32 = puVar32 + uVar25 + 1;
                    uVar28 = uVar33;
                  }
                } while (0 < (long)uVar28);
              }
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              if (uVar19 != val) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_01,sVar26);
                vVar11 = *pvVar21;
                iVar12 = (gdstate->levels_flat_native).state_size;
                puVar13 = (gdstate->levels_flat_native).states.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar14 = this->flush_count;
                *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
                this->flush_count = iVar14 + 1;
                *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + uVar19 + -1) * iVar12;
                if (0x7ff < iVar14 + 1) {
                  FlushStates(this);
                }
              }
              __n_00 = __n_00 + 1;
            }
            if (val != uVar9) {
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_00);
              vVar11 = *pvVar21;
              puVar32 = puVar10 + vVar11;
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,__n_00 + 0x20);
              uVar28 = *pvVar21 - vVar11;
              if (uVar28 != 0 && (long)vVar11 <= (long)*pvVar21) {
                do {
                  uVar25 = uVar28 >> 1;
                  uVar33 = ~uVar25 + uVar28;
                  uVar28 = uVar25;
                  if (puVar32[uVar25] < uVar1) {
                    puVar32 = puVar32 + uVar25 + 1;
                    uVar28 = uVar33;
                  }
                } while (0 < (long)uVar28);
              }
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              __n_00 = (uVar9 / uVar29) * 0x40 + (uVar19 & 0xffffffffffffffe0);
            }
            bVar15 = 2 < uVar22;
            uVar22 = sVar26;
          } while (bVar15);
        }
        if (1 < sVar26) {
          sVar26 = sVar26 - 1;
          do {
            uVar28 = uVar29 >> 5;
            pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                    *)this_00,sVar26);
            puVar10 = (pvVar18->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar22 = local_f8 - uVar30;
            while (uVar28 <= uVar22) {
              puVar32 = puVar10 + (local_f8 - uVar28);
              uVar22 = uVar28;
              puVar31 = puVar32;
              if (0x1f < uVar29) {
                do {
                  uVar25 = uVar22 >> 1;
                  if (puVar31[uVar25] < uVar1) {
                    puVar31 = puVar31 + uVar25 + 1;
                    uVar25 = ~uVar25 + uVar22;
                  }
                  uVar22 = uVar25;
                } while (0 < (long)uVar25);
              }
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar31 - (long)puVar10 >> 3);
              uVar23 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              if (uVar19 != uVar23) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_01,sVar26);
                vVar11 = *pvVar21;
                iVar12 = (gdstate->levels_flat_native).state_size;
                puVar13 = (gdstate->levels_flat_native).states.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar14 = this->flush_count;
                *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
                this->flush_count = iVar14 + 1;
                *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + uVar19 + -1) * iVar12;
                if (0x7ff < iVar14 + 1) {
                  FlushStates(this);
                }
              }
              local_f8 = local_f8 - uVar28;
              uVar22 = local_f8 - uVar30;
            }
            for (; uVar28 <= uVar9 - val; val = val + uVar28) {
              puVar32 = puVar10 + val;
              uVar22 = uVar28;
              do {
                uVar29 = uVar22 >> 1;
                uVar25 = ~uVar29 + uVar22;
                uVar22 = uVar29;
                if (puVar32[uVar29] < uVar1) {
                  puVar32 = puVar32 + uVar29 + 1;
                  uVar22 = uVar25;
                }
              } while (0 < (long)uVar22);
              uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                 ((long)puVar32 - (long)puVar10 >> 3);
              uVar23 = NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
              if (uVar19 != uVar23) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_01,sVar26);
                vVar11 = *pvVar21;
                iVar12 = (gdstate->levels_flat_native).state_size;
                puVar13 = (gdstate->levels_flat_native).states.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar14 = this->flush_count;
                *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
                this->flush_count = iVar14 + 1;
                *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + uVar19 + -1) * iVar12;
                if (0x7ff < iVar14 + 1) {
                  FlushStates(this);
                }
              }
            }
            sVar26 = sVar26 - 1;
            uVar29 = uVar28;
          } while (sVar26 != 0);
        }
        pvVar18 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                  ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                *)this_00,0);
        puVar10 = (pvVar18->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (; local_f8 != uVar30; uVar30 = uVar30 + 1) {
          if (puVar10[uVar30] < uVar1) {
            pvVar21 = vector<unsigned_long,_true>::operator[](this_01,0);
            vVar11 = *pvVar21;
            iVar12 = (gdstate->levels_flat_native).state_size;
            puVar13 = (gdstate->levels_flat_native).states.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar14 = this->flush_count;
            *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
            this->flush_count = iVar14 + 1;
            *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + uVar30) * iVar12;
            if (0x7ff < iVar14 + 1) {
              FlushStates(this);
            }
          }
        }
        for (; val != uVar9; val = val + 1) {
          if (puVar10[val] < uVar1) {
            pvVar21 = vector<unsigned_long,_true>::operator[](this_01,0);
            vVar11 = *pvVar21;
            iVar12 = (gdstate->levels_flat_native).state_size;
            puVar13 = (gdstate->levels_flat_native).states.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar14 = this->flush_count;
            *(pointer *)(pdVar3 + iVar14 * 8) = puVar24;
            this->flush_count = iVar14 + 1;
            *(pointer *)(pdVar4 + iVar14 * 8) = puVar13 + (vVar11 + val) * iVar12;
            if (0x7ff < iVar14 + 1) {
              FlushStates(this);
            }
          }
        }
      }
      iVar35 = iVar35 + 1;
      row_idx = row_idx + 1;
    } while (iVar35 != count);
  }
  FlushStates(this);
  WindowAggregateStates::Finalize(this_04,result);
  WindowAggregateStates::Destroy(this_04);
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Evaluate(const WindowDistinctAggregatorGlobalState &gdstate,
                                                  const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) {
	auto ldata = FlatVector::GetData<const_data_ptr_t>(statel);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	const auto &merge_sort_tree = gdstate.merge_sort_tree;
	const auto &levels_flat_native = gdstate.levels_flat_native;
	const auto exclude_mode = gdstate.aggregator.exclude_mode;

	//	Build the finalise vector that just points to the result states
	statef.Initialize(count);

	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = statef.GetStatePtr(rid);

		//	TODO: Extend AggregateLowerBound to handle subframes, just like SelectNth.
		const auto lower = frames[0].start;
		const auto upper = frames[0].end;
		merge_sort_tree.AggregateLowerBound(lower, upper, lower + 1,
		                                    [&](idx_t level, const idx_t run_begin, const idx_t run_pos) {
			                                    if (run_pos != run_begin) {
				                                    //	Find the source aggregate
				                                    // Buffer a merge of the indicated state into the current state
				                                    const auto agg_idx = gdstate.levels_flat_start[level] + run_pos - 1;
				                                    const auto running_agg = levels_flat_native.GetStatePtr(agg_idx);
				                                    pdata[flush_count] = agg_state;
				                                    ldata[flush_count++] = running_agg;
				                                    if (flush_count >= STANDARD_VECTOR_SIZE) {
					                                    FlushStates();
				                                    }
			                                    }
		                                    });
	});

	//	Flush the final states
	FlushStates();

	//	Finalise the result aggregates and write to the result
	statef.Finalize(result);

	//	Destruct any non-POD state
	statef.Destroy();
}